

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O3

QCommandLinkButtonPrivate * __thiscall
QCommandLinkButtonPrivate::titleFont(QCommandLinkButtonPrivate *this)

{
  undefined4 uVar1;
  bool bVar2;
  QCommandLinkButtonPrivate *in_RSI;
  long in_FS_OFFSET;
  uint uVar3;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_38,
               (QFont *)(*(long *)(*(long *)&(in_RSI->super_QPushButtonPrivate).
                                             super_QAbstractButtonPrivate.super_QWidgetPrivate.
                                             field_0x8 + 0x20) + 0x38));
  bVar2 = usingVistaStyle(in_RSI);
  if (bVar2) {
    uVar3 = 0x40280000;
  }
  else {
    QFont::setWeight((Weight)&local_38);
    uVar3 = 0x40220000;
  }
  QFont::setPointSizeF((double)((ulong)uVar3 << 0x20));
  uVar1 = puStack_30._0_4_;
  *(undefined1 **)
   &(this->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(this->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x8 =
       &DAT_aaaaaaaaaaaaaaaa;
  QFont::resolve((QFont *)this);
  QFont::detach();
  *(undefined4 *)
   &(this->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x8 =
       uVar1;
  QFont::~QFont((QFont *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFont QCommandLinkButtonPrivate::titleFont() const
{
    Q_Q(const QCommandLinkButton);
    QFont font = q->font();
    if (usingVistaStyle()) {
        font.setPointSizeF(12.0);
    } else {
        font.setBold(true);
        font.setPointSizeF(9.0);
    }

    // Note the font will be resolved against
    // QPainters font, so we need to restore the mask
    int resolve_mask = font.resolve_mask;
    QFont modifiedFont = q->font().resolve(font);
    modifiedFont.detach();
    modifiedFont.resolve_mask = resolve_mask;
    return modifiedFont;
}